

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakels_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  char *__s;
  ostream *poVar2;
  stdio_transporter local_1f8;
  transporter local_1c8;
  launch_config local_1c0;
  allocator<char> local_189;
  string local_188;
  cmake_language_server local_168;
  allocator<char> local_71;
  logger_config local_70;
  undefined1 local_48 [8];
  launch_config config;
  char **argv_local;
  int argc_local;
  
  lVar1 = *(long *)(std::cout + -0x18);
  config.logger.filename.field_2._8_8_ = argv;
  std::ios::rdbuf();
  std::ios::rdbuf((streambuf *)((long)&std::cout + lVar1));
  lscpp::launch_config::launch_config((launch_config *)local_48);
  local_48._0_4_ = 0;
  local_70.verbosity = Verbosity_9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70.filename,"cmakels.log",&local_71);
  lscpp::logger_config::operator=((logger_config *)&config,&local_70);
  lscpp::logger_config::~logger_config(&local_70);
  std::allocator<char>::~allocator(&local_71);
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage ");
    poVar2 = std::operator<<(poVar2,*(char **)config.logger.filename.field_2._8_8_);
    poVar2 = std::operator<<(poVar2," <build-dir>\n\n");
    poVar2 = std::operator<<(poVar2,
                             "<build-dir> - build directory relative to workspace root (usually defined by an IDE)"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  __s = *(char **)(config.logger.filename.field_2._8_8_ + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,__s,&local_189);
  cmakels::cmake_language_server::cmake_language_server(&local_168,&local_188);
  lscpp::launch_config::launch_config(&local_1c0,(launch_config *)local_48);
  lscpp::stdio_transporter::stdio_transporter(&local_1f8,false);
  lscpp::transporter::transporter<lscpp::stdio_transporter>(&local_1c8,&local_1f8);
  lscpp::launch(&local_168.super_lsp_server,&local_1c0,&local_1c8);
  lscpp::transporter::~transporter(&local_1c8);
  lscpp::stdio_transporter::~stdio_transporter(&local_1f8);
  lscpp::launch_config::~launch_config(&local_1c0);
  cmakels::cmake_language_server::~cmake_language_server(&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  lscpp::launch_config::~launch_config((launch_config *)local_48);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  // Redirect std::cout to std::cerr to ensure that  cmake doesn't write to
  // stdout and messes up with lsp communication.
  // IMPORTANT: we must never use std::cout for lsp communication!
  std::cout.rdbuf(std::cerr.rdbuf());

  lscpp::launch_config config;
#ifndef NDEBUG
  config.startup_delay = 0;
#endif
  config.logger = {lscpp::Verbosity_MAX, "cmakels.log"};

  if (argc < 2) {
    std::cerr << "Usage " << argv[0] << " <build-dir>\n\n"
              << "<build-dir> - build directory relative to workspace root "
                 "(usually defined by an IDE)"
              << std::endl;
    std::exit(1);
  } else {
    lscpp::launch(cmakels::cmake_language_server{argv[1]}, config,
                  lscpp::stdio_transporter{false});
  }
}